

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

int __thiscall luna::Lexer::LexId(Lexer *this,TokenDetail *detail)

{
  string *str;
  bool bVar1;
  int iVar2;
  int iVar3;
  String *pSVar4;
  LexException *this_00;
  char **extraout_RDX;
  char **__it;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **ppcVar5;
  char **extraout_RDX_02;
  difference_type __d;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_16_2_eed97686_for_String_2 *module;
  char **ppcVar9;
  char **ppcVar10;
  difference_type __d_1;
  difference_type __d_2;
  char **local_50;
  pointer local_38;
  
  iVar3 = this->current_;
  iVar2 = isalpha(iVar3);
  if ((iVar3 != 0x5f) && (iVar2 == 0)) {
    this_00 = (LexException *)__cxa_allocate_exception(0x20);
    pSVar4 = this->module_;
    if ((pSVar4->super_GCObject).field_0x11 == '\0') {
      module = &pSVar4->field_1;
    }
    else {
      module = (anon_union_16_2_eed97686_for_String_2 *)(pSVar4->field_1).str_;
    }
    LexException::LexException<char_const(&)[19]>
              (this_00,module->str_buffer_,this->line_,this->column_,
               (char (*) [19])"unexpect character");
    __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
  }
  (this->token_buffer_)._M_string_length = 0;
  str = &this->token_buffer_;
  *(this->token_buffer_)._M_dataplus._M_p = '\0';
  do {
    do {
      std::__cxx11::string::push_back((char)str);
      iVar3 = Next(this);
      this->current_ = iVar3;
      iVar2 = isalnum(iVar3);
    } while (iVar3 == 0x5f);
  } while (iVar2 != 0);
  local_38 = (str->_M_dataplus)._M_p;
  local_50 = (char **)(anonymous_namespace)::keyword;
  ppcVar5 = extraout_RDX;
  uVar7 = 0x15;
  do {
    while( true ) {
      uVar6 = uVar7;
      if ((long)uVar6 < 1) {
        iVar3 = 0x115;
        goto LAB_00140817;
      }
      uVar7 = uVar6 >> 1;
      ppcVar10 = local_50 + uVar7;
      bVar1 = __gnu_cxx::__ops::
              _Iter_comp_val<(anonymous_namespace)::IsKeyWord(std::__cxx11::string_const&,int*)::$_0>
              ::operator()(ppcVar10,&local_38,ppcVar5);
      if (!bVar1) break;
      local_50 = ppcVar10 + 1;
      ppcVar5 = __it;
      uVar7 = ~uVar7 + uVar6;
    }
    bVar1 = __gnu_cxx::__ops::
            _Val_comp_iter<(anonymous_namespace)::IsKeyWord(std::__cxx11::string_const&,int*)::$_0>
            ::operator()(&local_38,ppcVar10,__it);
    ppcVar5 = extraout_RDX_00;
    ppcVar9 = local_50;
  } while (bVar1);
  while (uVar8 = uVar7, 0 < (long)uVar8) {
    uVar7 = uVar8 >> 1;
    bVar1 = __gnu_cxx::__ops::
            _Iter_comp_val<(anonymous_namespace)::IsKeyWord(std::__cxx11::string_const&,int*)::$_0>
            ::operator()(ppcVar9 + uVar7,&local_38,ppcVar5);
    ppcVar5 = extraout_RDX_01;
    if (bVar1) {
      ppcVar9 = ppcVar9 + uVar7 + 1;
      uVar7 = ~uVar7 + uVar8;
    }
  }
  ppcVar10 = ppcVar10 + 1;
  uVar7 = (long)((long)local_50 + (uVar6 * 8 - (long)ppcVar10)) >> 3;
  while (uVar6 = uVar7, 0 < (long)uVar6) {
    uVar7 = uVar6 >> 1;
    bVar1 = __gnu_cxx::__ops::
            _Val_comp_iter<(anonymous_namespace)::IsKeyWord(std::__cxx11::string_const&,int*)::$_0>
            ::operator()(&local_38,ppcVar10 + uVar7,ppcVar5);
    ppcVar5 = extraout_RDX_02;
    if (!bVar1) {
      ppcVar10 = ppcVar10 + uVar7 + 1;
      uVar7 = ~uVar7 + uVar6;
    }
  }
  if (ppcVar9 == ppcVar10) {
    iVar3 = 0x115;
  }
  else {
    iVar3 = (int)((ulong)(ppcVar9 + -0x2b896) >> 3) + 0x100;
  }
LAB_00140817:
  pSVar4 = State::GetString(this->state_,str);
  (detail->field_0).str_ = pSVar4;
  detail->token_ = iVar3;
  iVar2 = this->column_;
  detail->line_ = this->line_;
  detail->column_ = iVar2;
  detail->module_ = this->module_;
  return iVar3;
}

Assistant:

int Lexer::LexId(TokenDetail *detail)
    {
        if (!isalpha(current_) && current_ != '_')
            throw LexException(module_->GetCStr(),
                    line_, column_, "unexpect character");

        token_buffer_.clear();
        token_buffer_.push_back(current_);
        current_ = Next();

        while (isalnum(current_) || current_ == '_')
        {
            token_buffer_.push_back(current_);
            current_ = Next();
        }

        int token = 0;
        if (!IsKeyWord(token_buffer_, &token))
            token = Token_Id;
        RETURN_TOKEN_DETAIL(detail, token_buffer_, token);
    }